

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QRhiGles2::setPipelineCacheData(QRhiGles2 *this,QByteArray *data)

{
  size_t __n;
  bool bVar1;
  quint32 qVar2;
  int iVar3;
  qsizetype qVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  uint *puVar8;
  ulong uVar9;
  undefined4 *puVar10;
  QByteArray *in_RSI;
  QRhiImplementation *in_RDI;
  long in_FS_OFFSET;
  quint32 i;
  char *p;
  size_t driverStrLen;
  quint32 arch;
  quint32 rhiId;
  size_t dataOffset;
  size_t headerSize;
  quint32 format;
  QByteArray data_1;
  QByteArray key;
  quint32 len;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QGles2PipelineCacheDataHeader header;
  QLoggingCategory *in_stack_fffffffffffffcf8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  uint local_2d4;
  uint *local_2d0;
  char local_298 [32];
  undefined4 local_278;
  undefined4 local_254;
  QByteArray local_250;
  QByteArray local_238;
  uint local_21c;
  char local_218 [32];
  char local_1f8 [32];
  unsigned_long local_1d8 [2];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [32];
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  quint32 local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  char acStack_f8 [240];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x91b12a);
  if (!bVar1) {
    qVar4 = QByteArray::size(in_RSI);
    if (qVar4 < 0x100) {
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::QRHI_LOG_INFO();
      anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_118), bVar1) {
        anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b1a7);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI,in_stack_fffffffffffffd08,
                   (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),(char *)in_stack_fffffffffffffcf8
                   ,(char *)0x91b1c0);
        QMessageLogger::debug
                  (local_188,"setPipelineCacheData: Invalid blob size (header incomplete)");
        local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
      }
    }
    else {
      memset(&local_108,0xaa,0x100);
      pcVar5 = QByteArray::constData((QByteArray *)0x91b20f);
      memcpy(&local_108,pcVar5,0x100);
      qVar2 = QRhiImplementation::pipelineCacheRhiId(in_RDI);
      if (local_108 == qVar2) {
        if (local_104 == 8) {
          if (local_100 != 0) {
            local_1d8[1] = 0xef;
            local_1d8[0] = QByteArray::size((QByteArray *)&in_RDI[1].accumulatedPipelineCreationTime
                                           );
            puVar6 = qMin<unsigned_long>(local_1d8 + 1,local_1d8);
            __n = *puVar6;
            pcVar5 = acStack_f8;
            pcVar7 = QByteArray::constData((QByteArray *)0x91b405);
            iVar3 = strncmp(pcVar5,pcVar7,__n);
            if (iVar3 == 0) {
              qVar4 = QByteArray::size(in_RSI);
              if (qVar4 < (long)((ulong)local_fc + 0x100)) {
                local_158 = &DAT_aaaaaaaaaaaaaaaa;
                local_150 = &DAT_aaaaaaaaaaaaaaaa;
                QtPrivateLogging::QRHI_LOG_INFO();
                anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
                while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                               operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_158),
                      bVar1) {
                  anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b525);
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)in_RDI,pcVar5,
                             (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                             (char *)in_stack_fffffffffffffcf8,(char *)0x91b53e);
                  QMessageLogger::debug
                            (local_218,"setPipelineCacheData: Invalid blob size (data incomplete)");
                  local_150 = (undefined1 *)((ulong)local_150 & 0xffffffffffffff00);
                }
              }
              else {
                QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear
                          ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)
                           in_stack_fffffffffffffd00);
                pcVar7 = QByteArray::constData((QByteArray *)0x91b57e);
                local_2d0 = (uint *)(pcVar7 + 0x100);
                for (local_2d4 = 0; local_2d4 < local_100; local_2d4 = local_2d4 + 1) {
                  local_21c = *local_2d0;
                  local_238.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_238.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                  local_238.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  QByteArray::QByteArray(&local_238,(ulong)local_21c,Uninitialized);
                  pcVar7 = QByteArray::data((QByteArray *)in_stack_fffffffffffffd00);
                  memcpy(pcVar7,local_2d0 + 1,(ulong)local_21c);
                  puVar8 = (uint *)((long)(local_2d0 + 1) + (ulong)local_21c);
                  local_21c = *puVar8;
                  puVar8 = puVar8 + 1;
                  local_250.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_250.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                  local_250.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  QByteArray::QByteArray(&local_250,(ulong)local_21c,Uninitialized);
                  pcVar7 = QByteArray::data((QByteArray *)in_stack_fffffffffffffd00);
                  memcpy(pcVar7,puVar8,(ulong)local_21c);
                  puVar10 = (undefined4 *)((long)puVar8 + (ulong)local_21c);
                  local_278 = *puVar10;
                  local_2d0 = puVar10 + 1;
                  in_stack_fffffffffffffd00 =
                       (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       (in_RDI[6].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x18);
                  local_254 = local_278;
                  QByteArray::QByteArray
                            ((QByteArray *)in_stack_fffffffffffffd00,
                             (QByteArray *)in_stack_fffffffffffffcf8);
                  QHash<QByteArray,_QRhiGles2::PipelineCacheData>::insert
                            ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)
                             in_stack_fffffffffffffd00,(QByteArray *)in_stack_fffffffffffffcf8,
                             (PipelineCacheData *)0x91b759);
                  PipelineCacheData::~PipelineCacheData((PipelineCacheData *)0x91b770);
                  QByteArray::~QByteArray((QByteArray *)0x91b77d);
                  QByteArray::~QByteArray((QByteArray *)0x91b78a);
                }
                local_168 = &DAT_aaaaaaaaaaaaaaaa;
                local_160 = &DAT_aaaaaaaaaaaaaaaa;
                QtPrivateLogging::QRHI_LOG_INFO();
                anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
                while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                               operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_168),
                      bVar1) {
                  anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b7ed);
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)in_RDI,pcVar5,
                             (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                             (char *)in_stack_fffffffffffffcf8,(char *)0x91b803);
                  uVar9 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::size
                                    ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)
                                     (in_RDI[6].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                      array + 0x18));
                  QMessageLogger::debug
                            (local_298,"Seeded pipeline cache with %d program binaries",
                             uVar9 & 0xffffffff);
                  local_160 = (undefined1 *)((ulong)local_160 & 0xffffffffffffff00);
                }
              }
            }
            else {
              local_148 = &DAT_aaaaaaaaaaaaaaaa;
              local_140 = &DAT_aaaaaaaaaaaaaaaa;
              QtPrivateLogging::QRHI_LOG_INFO();
              anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
              QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
              while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_148), bVar1
                    ) {
                anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b473);
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_RDI,pcVar5,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                           (char *)in_stack_fffffffffffffcf8,(char *)0x91b48c);
                QMessageLogger::debug
                          (local_1f8,
                           "setPipelineCacheData: OpenGL vendor/renderer/version does not match");
                local_140 = (undefined1 *)((ulong)local_140 & 0xffffffffffffff00);
              }
            }
          }
        }
        else {
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::QRHI_LOG_INFO();
          anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_138), bVar1) {
            anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b348);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_RDI,in_stack_fffffffffffffd08,
                       (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                       (char *)in_stack_fffffffffffffcf8,(char *)0x91b361);
            QMessageLogger::debug
                      (local_1c8,"setPipelineCacheData: Architecture does not match (%u, %u)",8,
                       (ulong)local_104);
            local_130 = (undefined1 *)((ulong)local_130 & 0xffffffffffffff00);
          }
        }
      }
      else {
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::QRHI_LOG_INFO();
        anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_128), bVar1) {
          anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91b296);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,in_stack_fffffffffffffd08,
                     (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (char *)in_stack_fffffffffffffcf8,(char *)0x91b2af);
          QMessageLogger::debug
                    (local_1a8,
                     "setPipelineCacheData: The data is for a different QRhi version or backend (%u, %u)"
                     ,(ulong)qVar2,(ulong)local_108);
          local_120 = (undefined1 *)((ulong)local_120 & 0xffffffffffffff00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::setPipelineCacheData(const QByteArray &data)
{
    if (data.isEmpty())
        return;

    const size_t headerSize = sizeof(QGles2PipelineCacheDataHeader);
    if (data.size() < qsizetype(headerSize)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Invalid blob size (header incomplete)");
        return;
    }
    const size_t dataOffset = headerSize;
    QGles2PipelineCacheDataHeader header;
    memcpy(&header, data.constData(), headerSize);

    const quint32 rhiId = pipelineCacheRhiId();
    if (header.rhiId != rhiId) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: The data is for a different QRhi version or backend (%u, %u)",
                rhiId, header.rhiId);
        return;
    }
    const quint32 arch = quint32(sizeof(void*));
    if (header.arch != arch) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Architecture does not match (%u, %u)",
                arch, header.arch);
        return;
    }
    if (header.programBinaryCount == 0)
        return;

    const size_t driverStrLen = qMin(sizeof(header.driver) - 1, size_t(driverInfoStruct.deviceName.size()));
    if (strncmp(header.driver, driverInfoStruct.deviceName.constData(), driverStrLen)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: OpenGL vendor/renderer/version does not match");
        return;
    }

    if (data.size() < qsizetype(dataOffset + header.dataSize)) {
        qCDebug(QRHI_LOG_INFO, "setPipelineCacheData: Invalid blob size (data incomplete)");
        return;
    }

    m_pipelineCache.clear();

    const char *p = data.constData() + dataOffset;
    for (quint32 i = 0; i < header.programBinaryCount; ++i) {
        quint32 len = 0;
        memcpy(&len, p, 4);
        p += 4;
        QByteArray key(len, Qt::Uninitialized);
        memcpy(key.data(), p, len);
        p += len;

        memcpy(&len, p, 4);
        p += 4;
        QByteArray data(len, Qt::Uninitialized);
        memcpy(data.data(), p, len);
        p += len;

        quint32 format;
        memcpy(&format, p, 4);
        p += 4;

        m_pipelineCache.insert(key, { format, data });
    }

    qCDebug(QRHI_LOG_INFO, "Seeded pipeline cache with %d program binaries", int(m_pipelineCache.size()));
}